

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberUtilities.cpp
# Opt level: O0

int Js::NumberUtilities::CbitZeroLeft(uint32 lu)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  int local_10;
  uint local_c;
  int cbit;
  uint32 lu_local;
  
  local_10 = 0;
  local_c = lu;
  if ((lu & 0xffff0000) == 0) {
    local_10 = 0x10;
    local_c = lu << 0x10;
  }
  if ((local_c & 0xff000000) == 0) {
    local_10 = local_10 + 8;
    local_c = local_c << 8;
  }
  if ((local_c & 0xf0000000) == 0) {
    local_10 = local_10 + 4;
    local_c = local_c << 4;
  }
  if ((local_c & 0xc0000000) == 0) {
    local_10 = local_10 + 2;
    local_c = local_c << 2;
  }
  if ((local_c & 0x80000000) == 0) {
    local_10 = local_10 + 1;
    local_c = local_c << 1;
  }
  if ((local_c & 0x80000000) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/NumberUtilities.cpp"
                                ,0xbd,"(lu & 0x80000000)","lu & 0x80000000");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return local_10;
}

Assistant:

int NumberUtilities::CbitZeroLeft(uint32 lu)
    {
        int cbit = 0;

        if (0 == (lu & 0xFFFF0000))
        {
            cbit += 16;
            lu <<= 16;
        }
        if (0 == (lu & 0xFF000000))
        {
            cbit += 8;
            lu <<= 8;
        }
        if (0 == (lu & 0xF0000000))
        {
            cbit += 4;
            lu <<= 4;
        }
        if (0 == (lu & 0xC0000000))
        {
            cbit += 2;
            lu <<= 2;
        }
        if (0 == (lu & 0x80000000))
        {
            cbit += 1;
            lu <<= 1;
        }
        Assert(lu & 0x80000000);

        return cbit;
    }